

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O0

void small_mempool_create_groups(small_alloc *alloc,small_mempool *first,small_mempool *last)

{
  small_mempool *last_00;
  small_mempool *last_in_group;
  small_mempool *first_in_group;
  small_mempool *last_local;
  small_mempool *first_local;
  small_alloc *alloc_local;
  
  last_in_group = first;
  while (last_in_group <= last) {
    last_00 = small_mempool_group_last_pool(last_in_group,last);
    small_mempool_create_group(alloc,last_in_group,last_00);
    last_in_group = last_00 + 1;
  }
  return;
}

Assistant:

static inline void
small_mempool_create_groups(struct small_alloc *alloc,
			    struct small_mempool *first,
			    struct small_mempool *last)
{
	struct small_mempool *first_in_group = first;
	while (first_in_group <= last) {
		struct small_mempool *last_in_group =
			small_mempool_group_last_pool(first_in_group, last);
		small_mempool_create_group(alloc, first_in_group,
					   last_in_group);
		first_in_group = last_in_group + 1;
	}
}